

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O3

void absl::lts_20240722::inlined_vector_internal::
     ConstructElements<std::allocator<absl::lts_20240722::status_internal::Payload>,absl::lts_20240722::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20240722::status_internal::Payload>,std::move_iterator<absl::lts_20240722::status_internal::Payload*>>>
               (type_identity_t<std::allocator<absl::lts_20240722::status_internal::Payload>_>
                *allocator,
               Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_>
               construct_first,
               IteratorValueAdapter<std::allocator<absl::lts_20240722::status_internal::Payload>,_std::move_iterator<absl::lts_20240722::status_internal::Payload_*>_>
               *values,SizeType<std::allocator<absl::lts_20240722::status_internal::Payload>_>
                       construct_size)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  CordRep *pCVar4;
  Payload *pPVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  
  if (construct_size != 0) {
    pPVar5 = (values->it_)._M_current;
    paVar6 = &(construct_first->type_url).field_2;
    do {
      (((string *)(paVar6 + -1))->_M_dataplus)._M_p = (pointer)paVar6;
      pcVar2 = (pPVar5->type_url)._M_dataplus._M_p;
      paVar1 = &(pPVar5->type_url).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 == paVar1) {
        sVar3 = *(size_type *)((long)&(pPVar5->type_url).field_2 + 8);
        paVar6->_M_allocated_capacity = paVar1->_M_allocated_capacity;
        *(size_type *)((long)paVar6 + 8) = sVar3;
      }
      else {
        (((string *)(paVar6 + -1))->_M_dataplus)._M_p = pcVar2;
        paVar6->_M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      *(size_type *)((long)paVar6 + -8) = (pPVar5->type_url)._M_string_length;
      (pPVar5->type_url)._M_dataplus._M_p = (pointer)paVar1;
      (pPVar5->type_url)._M_string_length = 0;
      (pPVar5->type_url).field_2._M_local_buf[0] = '\0';
      pCVar4 = (pPVar5->payload).contents_.data_.rep_.field_0.as_tree.rep;
      paVar6[1]._M_allocated_capacity =
           (pPVar5->payload).contents_.data_.rep_.field_0.as_tree.cordz_info;
      *(CordRep **)((long)paVar6 + 0x18) = pCVar4;
      (pPVar5->payload).contents_.data_.rep_.field_0.as_tree.cordz_info = 0;
      (pPVar5->payload).contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
      pPVar5 = (values->it_)._M_current + 1;
      (values->it_)._M_current = pPVar5;
      paVar6 = paVar6 + 3;
      construct_size = construct_size - 1;
    } while (construct_size != 0);
  }
  return;
}

Assistant:

void ConstructElements(absl::internal::type_identity_t<A>& allocator,
                       Pointer<A> construct_first, ValueAdapter& values,
                       SizeType<A> construct_size) {
  for (SizeType<A> i = 0; i < construct_size; ++i) {
    ABSL_INTERNAL_TRY { values.ConstructNext(allocator, construct_first + i); }
    ABSL_INTERNAL_CATCH_ANY {
      DestroyAdapter<A>::DestroyElements(allocator, construct_first, i);
      ABSL_INTERNAL_RETHROW;
    }